

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicssceneevent.cpp
# Opt level: O2

void __thiscall QGraphicsSceneEvent::QGraphicsSceneEvent(QGraphicsSceneEvent *this,Type type)

{
  QGraphicsSceneEventPrivate *pQVar1;
  
  QEvent::QEvent(&this->super_QEvent,type);
  *(undefined ***)this = &PTR__QGraphicsSceneHelpEvent_007edb00;
  pQVar1 = (QGraphicsSceneEventPrivate *)operator_new(0x20);
  pQVar1->_vptr_QGraphicsSceneEventPrivate = (_func_int **)&PTR__QGraphicsSceneEventPrivate_007edd88
  ;
  pQVar1->timestamp = 0;
  pQVar1->widget = (QWidget *)0x0;
  pQVar1->q_ptr = (QGraphicsSceneEvent *)0x0;
  (this->d_ptr).d = pQVar1;
  pQVar1->q_ptr = this;
  return;
}

Assistant:

QGraphicsSceneEvent::QGraphicsSceneEvent(Type type)
    : QEvent(type), d_ptr(new QGraphicsSceneEventPrivate)
{
    d_ptr->q_ptr = this;
}